

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v5::internal::
     handle_int_type_spec<char,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>>
               (char spec,int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 100) {
    if (iVar1 < 0x58) {
      if (iVar1 == 0) {
LAB_00134498:
        basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_dec(handler);
        return;
      }
      if (iVar1 == 0x42) {
LAB_0013447e:
        basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_bin(handler);
        return;
      }
    }
    else {
      if (iVar1 == 0x58) {
LAB_00134490:
        basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_hex(handler);
        return;
      }
      if (iVar1 == 0x62) goto LAB_0013447e;
    }
  }
  else if (iVar1 < 0x6f) {
    if (iVar1 == 100) goto LAB_00134498;
    if (iVar1 == 0x6e) {
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_num(handler);
      return;
    }
  }
  else {
    if (iVar1 == 0x6f) {
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_oct(handler);
      return;
    }
    if (iVar1 == 0x78) goto LAB_00134490;
  }
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_error(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(Char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'd':
    handler.on_dec();
    break;
  case 'x': case 'X':
    handler.on_hex();
    break;
  case 'b': case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}